

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O2

optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_> * __thiscall
slang::ast::InterfacePortSymbol::getDeclaredRange
          (optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
           *__return_storage_ptr__,InterfacePortSymbol *this)

{
  optional<std::span<const_slang::ConstantRange,_18446744073709551615UL>_> *poVar1;
  Scope *pSVar2;
  SyntaxNode *pSVar3;
  SyntaxNode *pSVar4;
  size_t sVar5;
  undefined7 uVar6;
  int iVar7;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX;
  size_t extraout_RDX_00;
  long lVar8;
  Compilation *dst;
  LookupLocation LVar9;
  EvaluatedDimension dim;
  SmallVector<slang::ConstantRange,_4UL> buffer;
  ASTContext context;
  
  poVar1 = &this->range;
  if ((this->range).
      super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
      _M_engaged == true) {
    uVar6 = *(undefined7 *)
             &(this->range).
              super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
              .field_0x11;
    (__return_storage_ptr__->
    super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>)
    ._M_payload.
    super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
    _M_engaged = (this->range).
                 super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
                 ._M_engaged;
    *(undefined7 *)
     &(__return_storage_ptr__->
      super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
      )._M_payload.
      super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
      field_0x11 = uVar6;
    sVar5 = (this->range).
            super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
            ._M_payload.
            super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
            ._M_payload._M_value._M_extent._M_extent_value;
    (__return_storage_ptr__->
    super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>)
    ._M_payload.
    super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
    _M_payload._M_value._M_ptr =
         (poVar1->
         super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
         )._M_payload.
         super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
         ._M_payload._M_value._M_ptr;
    (__return_storage_ptr__->
    super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>)
    ._M_payload.
    super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
    _M_payload._M_value._M_extent._M_extent_value = sVar5;
  }
  else if ((this->interfaceDef == (DefinitionSymbol *)0x0) && ((this->isGeneric & 1U) == 0)) {
    (poVar1->
    super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>)
    ._M_payload.
    super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
    _M_payload._M_value._M_ptr = (pointer)0x0;
    (this->range).
    super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>.
    _M_payload.
    super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
    _M_payload._M_value._M_extent._M_extent_value = 0;
    (this->range).
    super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>.
    _M_payload.
    super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
    _M_engaged = true;
    uVar6 = *(undefined7 *)
             &(this->range).
              super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
              .field_0x11;
    (__return_storage_ptr__->
    super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>)
    ._M_payload.
    super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
    _M_engaged = (this->range).
                 super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
                 ._M_engaged;
    *(undefined7 *)
     &(__return_storage_ptr__->
      super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
      )._M_payload.
      super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
      field_0x11 = uVar6;
    sVar5 = (this->range).
            super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
            ._M_payload.
            super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
            ._M_payload._M_value._M_extent._M_extent_value;
    (__return_storage_ptr__->
    super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>)
    ._M_payload.
    super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
    _M_payload._M_value._M_ptr =
         (poVar1->
         super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
         )._M_payload.
         super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
         ._M_payload._M_value._M_ptr;
    (__return_storage_ptr__->
    super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>)
    ._M_payload.
    super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
    _M_payload._M_value._M_extent._M_extent_value = sVar5;
  }
  else {
    pSVar2 = (this->super_Symbol).parentScope;
    pSVar3 = (this->super_Symbol).originatingSyntax;
    LVar9 = LookupLocation::before(&this->super_Symbol);
    src = LVar9._8_8_;
    context.lookupIndex = LVar9.index;
    context.flags.m_bits = 0x20;
    context.instanceOrProc = (Symbol *)0x0;
    context.firstTempVar = (TempVarSymbol *)0x0;
    context.randomizeDetails = (RandomizeDetails *)0x0;
    context.assertionInstance = (AssertionInstanceDetails *)0x0;
    buffer.super_SmallVectorBase<slang::ConstantRange>.data_ =
         (pointer)buffer.super_SmallVectorBase<slang::ConstantRange>.firstElement;
    buffer.super_SmallVectorBase<slang::ConstantRange>.len = 0;
    buffer.super_SmallVectorBase<slang::ConstantRange>.cap = 4;
    pSVar4 = pSVar3[3].parent;
    pSVar3 = pSVar3[3].previewNode;
    context.scope.ptr = pSVar2;
    for (lVar8 = 0; (long)pSVar3 << 3 != lVar8; lVar8 = lVar8 + 8) {
      dst = (Compilation *)&context;
      ASTContext::evalDimension
                (&dim,&context,*(VariableDimensionSyntax **)((long)&pSVar4->kind + lVar8),true,false
                );
      if (1 < dim.kind - Range) {
        (__return_storage_ptr__->
        super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
        )._M_payload.
        super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
        ._M_engaged = false;
        goto LAB_00202a14;
      }
      SmallVectorBase<slang::ConstantRange>::emplace_back<slang::ConstantRange_const&>
                (&buffer.super_SmallVectorBase<slang::ConstantRange>,&dim.range);
      src = extraout_RDX;
    }
    dst = pSVar2->compilation;
    iVar7 = SmallVectorBase<slang::ConstantRange>::copy
                      (&buffer.super_SmallVectorBase<slang::ConstantRange>,(EVP_PKEY_CTX *)dst,src);
    if ((this->range).
        super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
        ._M_engaged == false) {
      (this->range).
      super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
      ._M_payload.
      super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
      _M_engaged = true;
    }
    (this->range).
    super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>.
    _M_payload.
    super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
    _M_payload._M_value._M_ptr = (pointer)CONCAT44(extraout_var,iVar7);
    (this->range).
    super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>.
    _M_payload.
    super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
    _M_payload._M_value._M_extent._M_extent_value = extraout_RDX_00;
    uVar6 = *(undefined7 *)
             &(this->range).
              super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
              .field_0x11;
    (__return_storage_ptr__->
    super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>)
    ._M_payload.
    super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
    _M_engaged = (this->range).
                 super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
                 ._M_engaged;
    *(undefined7 *)
     &(__return_storage_ptr__->
      super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
      )._M_payload.
      super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
      field_0x11 = uVar6;
    sVar5 = (this->range).
            super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
            ._M_payload.
            super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
            ._M_payload._M_value._M_extent._M_extent_value;
    (__return_storage_ptr__->
    super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>)
    ._M_payload.
    super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
    _M_payload._M_value._M_ptr =
         (poVar1->
         super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>
         )._M_payload.
         super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>
         ._M_payload._M_value._M_ptr;
    (__return_storage_ptr__->
    super__Optional_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>,_true,_true>)
    ._M_payload.
    super__Optional_payload_base<std::span<const_slang::ConstantRange,_18446744073709551615UL>_>.
    _M_payload._M_value._M_extent._M_extent_value = sVar5;
LAB_00202a14:
    SmallVectorBase<slang::ConstantRange>::cleanup
              (&buffer.super_SmallVectorBase<slang::ConstantRange>,(EVP_PKEY_CTX *)dst);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::span<const ConstantRange>> InterfacePortSymbol::getDeclaredRange() const {
    if (range)
        return range;

    if (isInvalid()) {
        range.emplace();
        return range;
    }

    auto syntax = getSyntax();
    SLANG_ASSERT(syntax);

    auto scope = getParentScope();
    SLANG_ASSERT(scope);

    ASTContext context(*scope, LookupLocation::before(*this), ASTFlags::NonProcedural);

    SmallVector<ConstantRange, 4> buffer;
    for (auto dimSyntax : syntax->as<DeclaratorSyntax>().dimensions) {
        auto dim = context.evalDimension(*dimSyntax, /* requireRange */ true, /* isPacked */ false);
        if (!dim.isRange())
            return std::nullopt;

        buffer.push_back(dim.range);
    }

    range = buffer.copy(scope->getCompilation());
    return range;
}